

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

void __thiscall BailOutRecord::Dump(BailOutRecord *this)

{
  uint count;
  ArgOutOffsetInfo *pAVar1;
  int argOutSlotStart;
  uint in_ESI;
  ulong uVar2;
  uint i;
  ulong uVar3;
  
  if (this->localOffsetsCount != 0) {
    Output::Print(L"**** Locals ***\n");
    DumpLocalOffsets(this,in_ESI,argOutSlotStart);
  }
  if (this->argOutOffsetInfo != (ArgOutOffsetInfo *)0x0) {
    Output::Print(L"**** Out params ***\n");
    uVar2 = 0;
    for (uVar3 = 0; pAVar1 = this->argOutOffsetInfo, uVar3 < pAVar1->startCallCount;
        uVar3 = uVar3 + 1) {
      count = pAVar1->startCallOutParamCounts[uVar3];
      DumpArgOffsets(this,count,pAVar1->outParamOffsets + uVar2,pAVar1->argOutSymStart + (int)uVar2)
      ;
      uVar2 = (ulong)((int)uVar2 + count);
    }
  }
  return;
}

Assistant:

void BailOutRecord::Dump()
{
    if (this->localOffsetsCount)
    {
        Output::Print(_u("**** Locals ***\n"));
        DumpLocalOffsets(this->localOffsetsCount, 0);
    }

    uint outParamSlot = 0;
    if(this->argOutOffsetInfo)
    {
        Output::Print(_u("**** Out params ***\n"));
        for (uint i = 0; i < this->argOutOffsetInfo->startCallCount; i++)
        {
            uint startCallOutParamCount = this->argOutOffsetInfo->startCallOutParamCounts[i];
            DumpArgOffsets(startCallOutParamCount, &this->argOutOffsetInfo->outParamOffsets[outParamSlot], this->argOutOffsetInfo->argOutSymStart + outParamSlot);
            outParamSlot += startCallOutParamCount;
        }
    }
}